

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O0

void advance_lfo(FM_OPL *OPL)

{
  UINT8 tmp;
  FM_OPL *OPL_local;
  
  OPL->lfo_am_cnt = OPL->lfo_am_inc + OPL->lfo_am_cnt;
  if (0xd1ffffff < OPL->lfo_am_cnt) {
    OPL->lfo_am_cnt = OPL->lfo_am_cnt + 0x2e000000;
  }
  if (OPL->lfo_am_depth == '\0') {
    LFO_AM = (int)(uint)""[OPL->lfo_am_cnt >> 0x18] >> 2;
  }
  else {
    LFO_AM = (UINT32)""[OPL->lfo_am_cnt >> 0x18];
  }
  OPL->lfo_pm_cnt = OPL->lfo_pm_inc + OPL->lfo_pm_cnt;
  LFO_PM = OPL->lfo_pm_cnt >> 0x18 & 7 | (uint)OPL->lfo_pm_depth_range;
  return;
}

Assistant:

INLINE void advance_lfo(FM_OPL *OPL)
{
	UINT8 tmp;

	/* LFO */
	OPL->lfo_am_cnt += OPL->lfo_am_inc;
	if (OPL->lfo_am_cnt >= (UINT32)(LFO_AM_TAB_ELEMENTS<<LFO_SH) )	/* lfo_am_table is 210 elements long */
		OPL->lfo_am_cnt -= (LFO_AM_TAB_ELEMENTS<<LFO_SH);

	tmp = lfo_am_table[ OPL->lfo_am_cnt >> LFO_SH ];

	if (OPL->lfo_am_depth)
		LFO_AM = tmp;
	else
		LFO_AM = tmp>>2;

	OPL->lfo_pm_cnt += OPL->lfo_pm_inc;
	LFO_PM = ((OPL->lfo_pm_cnt>>LFO_SH) & 7) | OPL->lfo_pm_depth_range;
}